

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeRefining.cpp
# Opt level: O0

Pass * wasm::createTypeRefiningPass(void)

{
  TypeRefining *this;
  
  this = (TypeRefining *)operator_new(0x98);
  anon_unknown_173::TypeRefining::TypeRefining(this,false);
  return &this->super_Pass;
}

Assistant:

Pass* createTypeRefiningPass() { return new TypeRefining(false); }